

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pwm.c
# Opt level: O0

mraa_result_t mraa_pwm_unexport_force(mraa_pwm_context dev)

{
  uint uVar1;
  int __fd;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  ssize_t sVar5;
  char local_a8 [4];
  int size;
  char out [64];
  char local_58 [4];
  int unexport_f;
  char filepath [64];
  mraa_pwm_context dev_local;
  
  filepath._56_8_ = dev;
  snprintf(local_58,0x40,"/sys/class/pwm/pwmchip%d/unexport",(ulong)(uint)dev->chipid);
  __fd = open(local_58,1);
  if (__fd == -1) {
    uVar1 = *(uint *)filepath._56_8_;
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    syslog(3,"pwm_unexport: pwm%i: Failed to open unexport for writing: %s",(ulong)uVar1,pcVar4);
    dev_local._4_4_ = MRAA_ERROR_INVALID_RESOURCE;
  }
  else {
    iVar2 = snprintf(local_a8,0x40,"%d",(ulong)*(uint *)filepath._56_8_);
    sVar5 = write(__fd,local_a8,(long)iVar2);
    if (sVar5 == -1) {
      uVar1 = *(uint *)filepath._56_8_;
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      syslog(3,"pwm_unexport: pwm%i: Failed to write to unexport: %s",(ulong)uVar1,pcVar4);
      close(__fd);
      dev_local._4_4_ = MRAA_ERROR_UNSPECIFIED;
    }
    else {
      close(__fd);
      dev_local._4_4_ = MRAA_SUCCESS;
    }
  }
  return dev_local._4_4_;
}

Assistant:

mraa_result_t
mraa_pwm_unexport_force(mraa_pwm_context dev)
{
    char filepath[MAX_SIZE];
    snprintf(filepath, MAX_SIZE, "/sys/class/pwm/pwmchip%d/unexport", dev->chipid);

    int unexport_f = open(filepath, O_WRONLY);
    if (unexport_f == -1) {
        syslog(LOG_ERR, "pwm_unexport: pwm%i: Failed to open unexport for writing: %s", dev->pin, strerror(errno));
        return MRAA_ERROR_INVALID_RESOURCE;
    }

    char out[MAX_SIZE];
    int size = snprintf(out, MAX_SIZE, "%d", dev->pin);
    if (write(unexport_f, out, size * sizeof(char)) == -1) {
        syslog(LOG_ERR, "pwm_unexport: pwm%i: Failed to write to unexport: %s", dev->pin, strerror(errno));
        close(unexport_f);
        return MRAA_ERROR_UNSPECIFIED;
    }

    close(unexport_f);
    return MRAA_SUCCESS;
}